

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_3dPointListRef *
ON_3dPointListRef::FromPointArray
          (ON_3dPointListRef *__return_storage_ptr__,ON_SimpleArray<ON_3dPoint> *point_array)

{
  uint uVar1;
  ON_3dPoint *pOVar2;
  
  __return_storage_ptr__->m_fP = (float *)0x0;
  __return_storage_ptr__->m_point_count = 0;
  __return_storage_ptr__->m_point_stride = 0;
  __return_storage_ptr__->m_dP = (double *)0x0;
  uVar1 = point_array->m_count;
  pOVar2 = point_array->m_a;
  __return_storage_ptr__->m_fP = (float *)0x0;
  __return_storage_ptr__->m_point_count = 0;
  __return_storage_ptr__->m_point_stride = 0;
  __return_storage_ptr__->m_dP = (double *)0x0;
  if (pOVar2 != (ON_3dPoint *)0x0 && (ulong)uVar1 - 1 >> 1 < 0x7fffffff) {
    __return_storage_ptr__->m_point_count = uVar1;
    __return_storage_ptr__->m_point_stride = 3;
    __return_storage_ptr__->m_dP = &pOVar2->x;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPointListRef ON_3dPointListRef::FromPointArray(
  const class ON_SimpleArray<ON_3dPoint>& point_array
  )
{
  ON_3dPointListRef p;
  p.SetFromDoubleArray(point_array.UnsignedCount(),3,(const double*)point_array.Array());
  return p;
}